

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::validateKTXswizzle(ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  char *pcVar5;
  pointer pcVar6;
  VkFormat format;
  VkFormat extraout_EDX;
  VkFormat extraout_EDX_00;
  VkFormat extraout_EDX_01;
  VkFormat extraout_EDX_02;
  bool bVar7;
  string_view value;
  uint32_t local_64;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  string local_50;
  
  this->foundKTXswizzle = true;
  if (size == 0) {
    bVar7 = false;
    format = VK_FORMAT_UNDEFINED;
  }
  else {
    format = size - VK_FORMAT_R4G4_UNORM_PACK8;
    bVar7 = data[format] == '\0';
  }
  local_64 = size;
  if (bVar7 == false) {
    error<>(this,&Metadata::KTXswizzleMissingNull);
    format = extraout_EDX;
  }
  local_60._M_len = (size_t)(local_64 - bVar7);
  local_60._M_str = (char *)data;
  if (local_64 - bVar7 != 4) {
    error<unsigned_int&>(this,&Metadata::KTXswizzleInvalidSize,&local_64);
    format = extraout_EDX_00;
  }
  local_50._M_dataplus._M_p = (pointer)0x0;
  if ((pointer)local_60._M_len != (pointer)0x0) {
    do {
      _Var3._M_p = local_50._M_dataplus._M_p;
      pcVar2 = local_60._M_str;
      pcVar5 = (char *)memchr("rgba01",(int)local_60._M_str[(long)local_50._M_dataplus._M_p],6);
      format = extraout_EDX_01;
      if (pcVar5 == (char *)0x0 || pcVar5 == "") {
        error<unsigned_long&,char_const&>
                  (this,&Metadata::KTXswizzleInvalidValue,(unsigned_long *)&local_50,
                   pcVar2 + (long)_Var3._M_p);
        format = extraout_EDX_02;
      }
      local_50._M_dataplus._M_p = local_50._M_dataplus._M_p + 1;
      pcVar6 = (pointer)local_60._M_len;
      if ((pointer)0x3 < local_60._M_len) {
        pcVar6 = (pointer)0x4;
      }
    } while (local_50._M_dataplus._M_p < pcVar6);
  }
  uVar1 = (this->header).vkFormat;
  if ((uVar1 - 0x7f < 4) || ((uVar1 - 0x7c < 7 && (uVar1 - 0x7c != 3)))) {
    toString_abi_cxx11_(&local_50,(ktx *)(ulong)uVar1,format);
    warning<std::__cxx11::string>(this,&Metadata::KTXswizzleWithDepthOrStencil,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->checkGLTFBasisU == true) {
    if (((pointer)local_60._M_len == (pointer)0x4) &&
       (iVar4 = bcmp(local_60._M_str,"rgba",4), iVar4 == 0)) {
      return;
    }
    error<std::basic_string_view<char,std::char_traits<char>>const&>
              (this,&Metadata::KTXswizzleInvalidGLTFBU,&local_60);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXswizzle(const uint8_t* data, uint32_t size) {
    foundKTXswizzle = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXswizzleMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != 4)
        error(Metadata::KTXswizzleInvalidSize, size);

    for (std::size_t i = 0; i < std::min(std::size_t{4}, value.size()); ++i) {
        if (value.size() > i && !contains("rgba01", value[i]))
            error(Metadata::KTXswizzleInvalidValue, i, value[i]);
    }

    if (isFormatStencil(VkFormat(header.vkFormat)) || isFormatDepth(VkFormat(header.vkFormat)))
        warning(Metadata::KTXswizzleWithDepthOrStencil, toString(VkFormat(header.vkFormat)));

    if (checkGLTFBasisU && value != "rgba")
        error(Metadata::KTXswizzleInvalidGLTFBU, value);
}